

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-unwrap.cpp
# Opt level: O1

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  byte bVar1;
  FILE *__s1;
  int iVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  uint uVar7;
  bool bVar8;
  FILE *this_00;
  int iVar9;
  ui32_t length;
  allocator<char> local_d9;
  char **local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  string *local_c8;
  byte_t *local_c0;
  bool *local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  this->mode = MMT_EXTRACT;
  this->error_flag = true;
  this->key_flag = false;
  this->read_hmac = false;
  this->split_wav = false;
  this->mono_wav = false;
  this->verbose_flag = false;
  this->fb_dump_size = 0;
  this->no_write_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->stereo_image_flag = false;
  this->number_width = 6;
  this->start_frame = 0;
  this->duration = 0xffffffff;
  this->duration_flag = false;
  this->j2c_pedantic = true;
  this->picture_rate = 0x18;
  this->fb_size = 0x400000;
  this->file_prefix = (char *)0x0;
  this->channel_fmt = CF_NONE;
  this->input_filename = (char *)0x0;
  local_c8 = (string *)&this->prefix_buffer;
  local_d0 = &(this->prefix_buffer).field_2;
  (this->prefix_buffer)._M_dataplus._M_p = (pointer)local_d0;
  (this->prefix_buffer)._M_string_length = 0;
  (this->prefix_buffer).field_2._M_local_buf[0] = '\0';
  this->extension = "dcdata";
  this->key_id_value[0] = '\0';
  this->key_id_value[1] = '\0';
  this->key_id_value[2] = '\0';
  this->key_id_value[3] = '\0';
  this->key_id_value[4] = '\0';
  this->key_id_value[5] = '\0';
  this->key_id_value[6] = '\0';
  this->key_id_value[7] = '\0';
  this->key_id_value[8] = '\0';
  this->key_id_value[9] = '\0';
  this->key_id_value[10] = '\0';
  this->key_id_value[0xb] = '\0';
  this->key_id_value[0xc] = '\0';
  this->key_id_value[0xd] = '\0';
  this->key_id_value[0xe] = '\0';
  this->key_id_value[0xf] = '\0';
  this->key_value[0] = '\0';
  this->key_value[1] = '\0';
  this->key_value[2] = '\0';
  this->key_value[3] = '\0';
  this->key_value[4] = '\0';
  this->key_value[5] = '\0';
  this->key_value[6] = '\0';
  this->key_value[7] = '\0';
  this->key_value[8] = '\0';
  this->key_value[9] = '\0';
  this->key_value[10] = '\0';
  this->key_value[0xb] = '\0';
  this->key_value[0xc] = '\0';
  this->key_value[0xd] = '\0';
  this->key_value[0xe] = '\0';
  this->key_value[0xf] = '\0';
  bVar8 = 1 < argc;
  this_00 = (FILE *)this;
  if (1 < argc) {
    local_b8 = &this->key_flag;
    local_c0 = this->key_value;
    iVar9 = 1;
    local_d8 = argv;
    do {
      __s1 = (FILE *)argv[iVar9];
      this_00 = __s1;
      iVar2 = strcmp((char *)__s1,"-help");
      if (iVar2 == 0) {
switchD_0010ba65_caseD_68:
        this->help_flag = true;
        goto LAB_0010ba73;
      }
      if ((char)__s1->_flags != '-') {
        if (this->input_filename == (char *)0x0) {
          this->input_filename = (char *)__s1;
        }
        else if (this->file_prefix == (char *)0x0) {
          this->file_prefix = (char *)__s1;
        }
        goto LAB_0010ba73;
      }
      bVar1 = *(byte *)((long)&__s1->_flags + 1);
      uVar7 = (uint)(char)bVar1;
      this_00 = (FILE *)(ulong)uVar7;
      iVar2 = isalpha(uVar7);
      argv = local_d8;
      if ((9 < uVar7 - 0x30 && iVar2 == 0) || (*(char *)((long)&__s1->_flags + 2) != '\0')) {
        this_00 = _stderr;
        fprintf(_stderr,"Unrecognized argument: %s\n",__s1);
        goto LAB_0010bd13;
      }
      if (bVar1 < 0x47) {
        if (bVar1 == 0x31) {
          this->mono_wav = true;
        }
        else if (bVar1 == 0x32) {
          this->split_wav = true;
        }
        else {
          if (bVar1 != 0x33) goto switchD_0010ba65_caseD_58;
          this->stereo_image_flag = true;
        }
        goto LAB_0010ba73;
      }
      switch(bVar1) {
      case 0x56:
        this->version_flag = true;
        break;
      case 0x57:
        this->no_write_flag = true;
        break;
      case 0x58:
      case 0x59:
      case 0x5b:
      case 0x5c:
      case 0x5d:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 0x61:
      case 99:
      case 0x67:
      case 0x69:
      case 0x6a:
      case 0x6c:
      case 0x6e:
      case 0x6f:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x75:
      case 0x78:
      case 0x79:
switchD_0010ba65_caseD_58:
        this_00 = _stderr;
        fprintf(_stderr,"Unrecognized option: %s\n",__s1);
        goto LAB_0010bd13;
      case 0x5a:
        this->j2c_pedantic = false;
        break;
      case 0x62:
        iVar9 = iVar9 + 1;
        if ((argc <= iVar9) || (this_00 = (FILE *)local_d8[iVar9], (char)this_00->_flags == '-')) {
          CommandOptions((CommandOptions *)this_00);
          goto LAB_0010bd13;
        }
        lVar3 = strtol((char *)this_00,(char **)0x0,10);
        lVar5 = -lVar3;
        if (0 < lVar3) {
          lVar5 = lVar3;
        }
        this->fb_size = (ui32_t)lVar5;
        break;
      case 100:
        iVar9 = iVar9 + 1;
        if ((argc <= iVar9) || (this_00 = (FILE *)local_d8[iVar9], (char)this_00->_flags == '-')) {
          CommandOptions((CommandOptions *)this_00);
          goto LAB_0010bd13;
        }
        this->duration_flag = true;
        lVar3 = strtol((char *)this_00,(char **)0x0,10);
        lVar5 = -lVar3;
        if (0 < lVar3) {
          lVar5 = lVar3;
        }
        this->duration = (ui32_t)lVar5;
        break;
      case 0x65:
        iVar9 = iVar9 + 1;
        if ((argc <= iVar9) || (*local_d8[iVar9] == '-')) {
          CommandOptions((CommandOptions *)this_00);
          goto LAB_0010bd13;
        }
        this->extension = local_d8[iVar9];
        break;
      case 0x66:
        iVar9 = iVar9 + 1;
        if ((argc <= iVar9) || (this_00 = (FILE *)local_d8[iVar9], (char)this_00->_flags == '-')) {
          CommandOptions((CommandOptions *)this_00);
          goto LAB_0010bd13;
        }
        lVar3 = strtol((char *)this_00,(char **)0x0,10);
        lVar5 = -lVar3;
        if (0 < lVar3) {
          lVar5 = lVar3;
        }
        this->start_frame = (ui32_t)lVar5;
        break;
      case 0x68:
        goto switchD_0010ba65_caseD_68;
      case 0x6b:
        *local_b8 = true;
        iVar9 = iVar9 + 1;
        if ((iVar9 < argc) && (this_00 = (FILE *)local_d8[iVar9], (char)this_00->_flags != '-')) {
          Kumu::hex2bin((char *)this_00,local_c0,0x10,(uint *)&local_90);
          if ((int)local_90 == 0x10) break;
          this_00 = _stderr;
          fprintf(_stderr,"Unexpected key length: %u, expecting %u characters.\n",
                  (ulong)local_90 & 0xffffffff,0x10);
        }
        else {
          CommandOptions((CommandOptions *)this_00);
        }
LAB_0010bd13:
        if (bVar8) {
          return;
        }
        goto LAB_0010bd1d;
      case 0x6d:
        this->read_hmac = true;
        break;
      case 0x70:
        iVar9 = iVar9 + 1;
        if ((argc <= iVar9) || (this_00 = (FILE *)local_d8[iVar9], (char)this_00->_flags == '-')) {
          CommandOptions((CommandOptions *)this_00);
          goto LAB_0010bd13;
        }
        lVar3 = strtol((char *)this_00,(char **)0x0,10);
        lVar5 = -lVar3;
        if (0 < lVar3) {
          lVar5 = lVar3;
        }
        this->picture_rate = (ui32_t)lVar5;
        break;
      case 0x73:
        iVar9 = iVar9 + 1;
        if ((argc <= iVar9) || (this_00 = (FILE *)local_d8[iVar9], (char)this_00->_flags == '-')) {
          CommandOptions((CommandOptions *)this_00);
          goto LAB_0010bd13;
        }
        lVar3 = strtol((char *)this_00,(char **)0x0,10);
        lVar5 = -lVar3;
        if (0 < lVar3) {
          lVar5 = lVar3;
        }
        this->fb_dump_size = (ui32_t)lVar5;
        break;
      case 0x76:
        this->verbose_flag = true;
        break;
      case 0x77:
        iVar9 = iVar9 + 1;
        if ((argc <= iVar9) || (this_00 = (FILE *)local_d8[iVar9], (char)this_00->_flags == '-')) {
          CommandOptions((CommandOptions *)this_00);
          goto LAB_0010bd13;
        }
        lVar3 = strtol((char *)this_00,(char **)0x0,10);
        lVar5 = -lVar3;
        if (0 < lVar3) {
          lVar5 = lVar3;
        }
        this->number_width = (ui32_t)lVar5;
        break;
      case 0x7a:
        this->j2c_pedantic = true;
        break;
      default:
        if (bVar1 != 0x47) goto switchD_0010ba65_caseD_58;
        this->mode = MMT_GOP_START;
      }
LAB_0010ba73:
      iVar9 = iVar9 + 1;
      bVar8 = iVar9 < argc;
    } while (iVar9 < argc);
  }
LAB_0010bd1d:
  if ((this->help_flag == false) && (this->version_flag == false)) {
    if (this->input_filename == (char *)0x0 && this->mode - MMT_EXTRACT < 2) {
      CommandOptions((CommandOptions *)this_00);
    }
    else {
      if ((this->mode == MMT_EXTRACT) && (this->file_prefix == (char *)0x0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_70,this->input_filename,&local_d9);
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
        Kumu::PathSetExtension((string *)local_50,(string *)local_70);
        plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_80 = *plVar6;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar6;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::operator=(local_c8,(string *)&local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        this->file_prefix = (this->prefix_buffer)._M_dataplus._M_p;
      }
      this->error_flag = false;
    }
  }
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    mode(MMT_EXTRACT), error_flag(true), key_flag(false), read_hmac(false), split_wav(false),
    mono_wav(false), verbose_flag(false), fb_dump_size(0), no_write_flag(false),
    version_flag(false), help_flag(false), stereo_image_flag(false), number_width(6),
    start_frame(0), duration(0xffffffff), duration_flag(false), j2c_pedantic(true),
    picture_rate(24), fb_size(FRAME_BUFFER_SIZE), file_prefix(0),
    channel_fmt(PCM::CF_NONE), input_filename(0), extension("dcdata")
  {
    memset(key_value, 0, KeyLen);
    memset(key_id_value, 0, UUIDlen);

    for ( int i = 1; i < argc; ++i )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }

	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case '1': mono_wav = true; break;
	      case '2': split_wav = true; break;
	      case '3': stereo_image_flag = true; break;

	      case 'b':
		TEST_EXTRA_ARG(i, 'b');
		fb_size = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'd':
		TEST_EXTRA_ARG(i, 'd');
		duration_flag = true;
		duration = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'e':
		TEST_EXTRA_ARG(i, 'e');
		extension = argv[i];
		break;

	      case 'f':
		TEST_EXTRA_ARG(i, 'f');
		start_frame = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'G': mode = MMT_GOP_START; break;
	      case 'h': help_flag = true; break;

	      case 'k': key_flag = true;
		TEST_EXTRA_ARG(i, 'k');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_value, KeyLen, &length);

		  if ( length != KeyLen )
		    {
		      fprintf(stderr, "Unexpected key length: %u, expecting %u characters.\n", length, KeyLen);
		      return;
		    }
		}
		break;

	      case 'm': read_hmac = true; break;

	      case 'p':
		TEST_EXTRA_ARG(i, 'p');
		picture_rate = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 's':
		TEST_EXTRA_ARG(i, 's');
		fb_dump_size = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'W': no_write_flag = true; break;

	      case 'w':
		TEST_EXTRA_ARG(i, 'w');
		number_width = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'Z': j2c_pedantic = false; break;
	      case 'z': j2c_pedantic = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    if ( argv[i][0] != '-' )
	      {
		if ( input_filename == 0 )
		  {
		    input_filename = argv[i];
		  }
		else if ( file_prefix == 0 )
		  {
		    file_prefix = argv[i];
		  }
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }
	  }
      }

    if ( help_flag || version_flag )
      return;

    if ( (  mode == MMT_EXTRACT || mode == MMT_GOP_START ) && input_filename == 0 )
      {
	fputs("Option requires at least one filename argument.\n", stderr);
	return;
      }

    if ( mode == MMT_EXTRACT  && file_prefix == 0 )
      {
	prefix_buffer = Kumu::PathSetExtension(input_filename, "") + "_";
	file_prefix = prefix_buffer.c_str();
      }

    error_flag = false;
  }